

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O1

void __thiscall
wasm::InstrumentLocals::addImport
          (InstrumentLocals *this,Module *wasm,Name name,Type params,Type results)

{
  char *pcVar1;
  Signature sig;
  Name name_00;
  HeapType local_50;
  void *local_48;
  Type TStack_40;
  long local_38;
  _Head_base<0UL,_wasm::Function_*,_false> local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  sig.results.id = results.id;
  sig.params.id = params.id;
  HeapType::HeapType(&local_50,sig);
  local_48 = (void *)0x0;
  TStack_40.id = 0;
  local_38 = 0;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_30;
  Builder::makeFunction
            (name_00,(HeapType)name.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,(Expression *)&local_48)
  ;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  pcVar1 = DAT_00dbd8a0;
  ((local_30._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
  ((local_30._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
  ((local_30._M_head_impl)->super_Importable).base.super_IString.str._M_len =
       (size_t)name.super_IString.str._M_len;
  ((local_30._M_head_impl)->super_Importable).base.super_IString.str._M_str =
       (char *)name.super_IString.str._M_str;
  Module::addFunction(wasm,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                           &local_30);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_30);
  return;
}

Assistant:

void addImport(Module* wasm, Name name, Type params, Type results) {
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    wasm->addFunction(std::move(import));
  }